

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_19656::getIDLAbsoluteNamespace
          (string *__return_storage_ptr__,anon_unknown_dwarf_19656 *this,string *type_ns,
          IDLExport *exporter)

{
  pointer pcVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string suffix;
  string prefix;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&type_ns->_M_dataplus);
  pcVar1 = (exporter->m_ns_prefix)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (exporter->m_ns_prefix)._M_string_length);
  pcVar1 = (exporter->m_ns_suffix)._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (exporter->m_ns_suffix)._M_string_length);
  psVar2 = extraout_RAX;
  if (local_68._M_string_length != 0) {
    std::operator+(&local_48,&local_68,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    psVar2 = (string *)&local_48.field_2;
    if ((string *)local_48._M_dataplus._M_p != psVar2) {
      operator_delete(local_48._M_dataplus._M_p);
      psVar2 = extraout_RAX_00;
    }
  }
  if (local_80 != 0) {
    psVar2 = (string *)
             std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
    psVar2 = extraout_RAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    psVar2 = extraout_RAX_02;
  }
  return psVar2;
}

Assistant:

static string getIDLAbsoluteNamespace(std::string const& type_ns, IDLExport const& exporter)
    {
        string ns = type_ns;
        string prefix = exporter.getNamespacePrefix();
        string suffix = exporter.getNamespaceSuffix();
        if (!prefix.empty())
            ns = prefix + ns;
        if (!suffix.empty())
            ns += suffix;
        return ns;
    }